

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O2

void __thiscall cppcms::widgets::select_base::add(select_base *this,message *str)

{
  string id;
  string sStack_108;
  element local_e8;
  
  impl::todec_string<unsigned_long>
            (&sStack_108,
             ((long)(this->elements_).
                    super__Vector_base<cppcms::widgets::select_base::element,_std::allocator<cppcms::widgets::select_base::element>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->elements_).
                   super__Vector_base<cppcms::widgets::select_base::element,_std::allocator<cppcms::widgets::select_base::element>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0xd0);
  element::element(&local_e8,&sStack_108,str);
  std::
  vector<cppcms::widgets::select_base::element,_std::allocator<cppcms::widgets::select_base::element>_>
  ::emplace_back<cppcms::widgets::select_base::element>(&this->elements_,&local_e8);
  element::~element(&local_e8);
  std::__cxx11::string::~string((string *)&sStack_108);
  return;
}

Assistant:

void select_base::add(locale::message const &str)
{
	std::string id= impl::todec_string(elements_.size());
	elements_.push_back(element(id,str));
}